

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O0

void cl_send_cb(uv_udp_send_t *req,int status)

{
  void *eval_b;
  void *eval_a;
  int status_local;
  uv_udp_send_t *req_local;
  
  if (req == (uv_udp_send_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-immediate.c"
            ,0x3b,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-immediate.c"
            ,0x3c,"status == 0");
    abort();
  }
  if ((req->handle != &server) && (req->handle != &client)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-immediate.c"
            ,0x3d,"(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client");
    abort();
  }
  cl_send_cb_called = cl_send_cb_called + 1;
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  r = uv_udp_recv_start(req->handle, cl_alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  cl_send_cb_called++;
}